

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O1

bool __thiscall icu_63::number::impl::MacroProps::copyErrorTo(MacroProps *this,UErrorCode *status)

{
  UNumberCompactStyle UVar1;
  bool bVar2;
  
  if ((this->notation).fType == NTN_ERROR) {
    UVar1 = (this->notation).fUnion.compactStyle;
  }
  else if ((this->precision).fType == RND_ERROR) {
    UVar1 = (this->precision).fUnion.currencyUsage;
  }
  else if ((this->padder).fWidth == -3) {
    UVar1 = (this->padder).fUnion.padding.fCp;
  }
  else {
    if ((this->integerWidth).fHasError != true) {
      if (((this->symbols).fType - SYMPTR_DFS < 2) &&
         ((this->symbols).fPtr.dfs == (DecimalFormatSymbols *)0x0)) {
        bVar2 = true;
        UVar1 = 7;
      }
      else {
        UVar1 = (this->scale).fError;
        bVar2 = UVar1 != UNUM_SHORT;
        if (!bVar2) {
          return bVar2;
        }
      }
      goto LAB_0025e99d;
    }
    UVar1 = (this->integerWidth).fUnion.errorCode;
  }
  bVar2 = true;
LAB_0025e99d:
  *status = UVar1;
  return bVar2;
}

Assistant:

UBool copyErrorTo(UErrorCode &status) const {
        if (fType == NTN_ERROR) {
            status = fUnion.errorCode;
            return TRUE;
        }
        return FALSE;
    }